

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

int anon_unknown.dwarf_26820::run_deletion(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  pointer pDVar5;
  long in_RSI;
  int in_EDI;
  double dVar6;
  ofstream ofs;
  string dic_name;
  char *key;
  StopWatch sw;
  uint32_t N;
  KeyReader reader;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> dic;
  KeyReader *in_stack_fffffffffffffa48;
  KeyReader *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  char *in_stack_fffffffffffffa68;
  undefined7 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa77;
  undefined8 in_stack_fffffffffffffa88;
  Times type;
  char *pcVar7;
  StopWatch *in_stack_fffffffffffffa90;
  allocator *paVar8;
  long local_500 [2];
  undefined1 in_stack_fffffffffffffb17;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *in_stack_fffffffffffffb18;
  ostream *in_stack_fffffffffffffb20;
  allocator local_2f9;
  string local_2f8 [16];
  string *in_stack_fffffffffffffd18;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  char *local_290;
  StopWatch local_288;
  uint local_27c;
  uint local_50;
  allocator local_39;
  string local_38 [40];
  long local_10;
  int local_8;
  int local_4;
  
  local_10 = in_RSI;
  local_8 = in_EDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"run deletion");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (local_8 < 5) {
    show_usage((ostream *)0x14a28e);
    local_4 = 1;
  }
  else {
    pcVar7 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar7,&local_39);
    read_dic(in_stack_fffffffffffffd18);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                       0x14a324);
    if (bVar1) {
      KeyReader::KeyReader
                ((KeyReader *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
                 in_stack_fffffffffffffa68);
      bVar1 = KeyReader::is_ready((KeyReader *)0x14a3b4);
      if (bVar1) {
        local_27c = 0;
        StopWatch::StopWatch((StopWatch *)in_stack_fffffffffffffa50);
        while( true ) {
          local_290 = KeyReader::next(in_stack_fffffffffffffa48);
          type = (Times)((ulong)in_stack_fffffffffffffa88 >> 0x20);
          if (local_290 == (char *)0x0) break;
          pDVar5 = std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::
                   operator->((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                              0x14a4d0);
          iVar3 = (*pDVar5->_vptr_Dictionary[5])(pDVar5,local_290);
          if (iVar3 == -1) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"failed to delete ");
            poVar4 = std::operator<<(poVar4,local_290);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            local_4 = 1;
            local_50 = 1;
            goto LAB_0014a62b;
          }
          local_27c = local_27c + 1;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"- deletion time: ");
        dVar6 = StopWatch::operator()(in_stack_fffffffffffffa90,type);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6 / (double)local_27c);
        poVar4 = std::operator<<(poVar4," us / key");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_50 = 0;
LAB_0014a62b:
        StopWatch::~StopWatch(&local_288);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"failed to open ");
        poVar4 = std::operator<<(poVar4,*(char **)(local_10 + 0x20));
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        local_50 = 1;
      }
      KeyReader::~KeyReader(in_stack_fffffffffffffa50);
      if (local_50 == 0) {
        show_stat(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                  (bool)in_stack_fffffffffffffb17);
        pcVar7 = *(char **)(local_10 + 0x18);
        paVar8 = &local_2b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b0,pcVar7,paVar8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        std::__cxx11::string::operator+=(local_2b0,".");
        pcVar7 = *(char **)(local_10 + 0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f8,pcVar7,&local_2f9);
        get_ext(in_stack_fffffffffffffa58);
        std::__cxx11::string::operator+=(local_2b0,local_2d8);
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string(local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
        std::ofstream::ofstream(local_500,local_2b0,0x10);
        bVar2 = std::ios::operator!((ios *)((long)local_500 + *(long *)(local_500[0] + -0x18)));
        bVar1 = (bVar2 & 1) != 0;
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"failed to open ");
          poVar4 = std::operator<<(poVar4,local_2b0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_4 = 1;
        }
        else {
          pDVar5 = std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::
                   operator->((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                              0x14a8fa);
          (*pDVar5->_vptr_Dictionary[0xc])(pDVar5,local_500);
        }
        local_50 = (uint)bVar1;
        std::ofstream::~ofstream(local_500);
        if (local_50 == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"write dic to ");
          in_stack_fffffffffffffa50 = (KeyReader *)std::operator<<(poVar4,local_2b0);
          std::ostream::operator<<(in_stack_fffffffffffffa50,std::endl<char,std::char_traits<char>>)
          ;
          local_4 = 0;
          local_50 = 1;
        }
        std::__cxx11::string::~string(local_2b0);
      }
    }
    else {
      local_4 = 1;
      local_50 = 1;
    }
    std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::~unique_ptr
              ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
               in_stack_fffffffffffffa50);
  }
  return local_4;
}

Assistant:

int run_deletion(int argc, const char* argv[]) {
  std::cout << "run deletion" << std::endl;

  if (argc < 5) {
    show_usage(std::cerr);
    return 1;
  }

  auto dic = read_dic(argv[2]);
  if (!dic) {
    return 1;
  }

  {
    KeyReader reader{argv[4]};
    if (!reader.is_ready()) {
      std::cerr << "failed to open " << argv[4] << std::endl;
      return 1;
    }

    uint32_t N = 0;
    StopWatch sw;

    while (auto key = reader.next()) {
      if (dic->delete_key(key) == NOT_FOUND) {
        std::cerr << "failed to delete " << key << std::endl;
        return 1;
      }
      ++N;
    }

    std::cout << "- deletion time: " << sw(Times::micro) / N << " us / key" << std::endl;
  }

  show_stat(std::cout, dic, true);

  std::string dic_name{argv[3]};
  dic_name += ".";
  dic_name += get_ext(argv[2]);

  {
    std::ofstream ofs{dic_name};
    if (!ofs) {
      std::cerr << "failed to open " << dic_name << std::endl;
      return 1;
    }
    dic->write(ofs);
  }
  std::cout << "write dic to " << dic_name << std::endl;

  return 0;
}